

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  unsigned_long *puVar1;
  StringPiece characters_wanted;
  byte local_148 [8];
  bool lookup [256];
  unsigned_long local_40;
  unsigned_long local_38;
  stringpiece_ssize_type i;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  if (this->length_ < 1) {
    s_local.length_ = -1;
  }
  else {
    local_40 = this->length_ - 1;
    i = pos;
    pos_local = (size_type)this;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&i,&local_40);
    local_38 = *puVar1;
    s_local.length_ = local_38;
    if (0 < (long)s_local.ptr_) {
      if (s_local.ptr_ == (char *)0x1) {
        s_local.length_ = find_last_not_of(this,*(char *)&this_local->ptr_,i);
      }
      else {
        memset(local_148,0,0x100);
        characters_wanted.length_ = (stringpiece_ssize_type)local_148;
        characters_wanted.ptr_ = s_local.ptr_;
        BuildLookupTable((protobuf *)this_local,characters_wanted,(bool *)pos);
        for (; -1 < (long)local_38; local_38 = local_38 - 1) {
          if ((local_148[(byte)this->ptr_[local_38]] & 1) == 0) {
            return local_38;
          }
        }
        s_local.length_ = -1;
      }
    }
  }
  return s_local.length_;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  stringpiece_ssize_type i = std::min(pos, static_cast<size_type>(length_ - 1));
  if (s.length_ <= 0) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (; i >= 0; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}